

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

bool __thiscall DirectiveObjImport::Validate(DirectiveObjImport *this,ValidateState *state)

{
  CAssemblerCommand *pCVar1;
  byte bVar2;
  int64_t memory;
  size_t local_28;
  int iVar3;
  
  pCVar1 = (this->ctor)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  if (pCVar1 == (CAssemblerCommand *)0x0) {
    bVar2 = 0;
  }
  else {
    iVar3 = (*pCVar1->_vptr_CAssemblerCommand[2])();
    bVar2 = (byte)iVar3;
  }
  local_28 = FileManager::getVirtualAddress(g_fileManager);
  ElfRelocator::relocate(&this->rel,(int64_t *)&local_28);
  FileManager::advanceMemory(g_fileManager,local_28);
  return (bool)(bVar2 | (this->rel).dataChanged);
}

Assistant:

bool DirectiveObjImport::Validate(const ValidateState &state)
{
	bool result = false;
	if (ctor != nullptr && ctor->Validate(state))
		result = true;

	int64_t memory = g_fileManager->getVirtualAddress();
	rel.relocate(memory);
	g_fileManager->advanceMemory((size_t)memory);

	return rel.hasDataChanged() || result;
}